

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_geometry(Impl *this)

{
  ExecutionMode mode;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value1;
  uint uVar4;
  Builder *this_00;
  MDOperand *md;
  MDNode *node;
  Function *entryPoint;
  void *pvVar5;
  LoggingCallback p_Var6;
  char *pcVar7;
  char buffer [4096];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityGeometry);
  md = get_shader_property_tag(this->entry_point_meta,GSState);
  if (md == (MDOperand *)0x0) {
    return false;
  }
  node = LLVMBC::cast<LLVMBC::MDNode>(md);
  uVar1 = get_constant_metadata<unsigned_int>(node,0);
  uVar2 = get_constant_metadata<unsigned_int>(node,1);
  entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
  uVar3 = get_constant_metadata<unsigned_int>(node,3);
  value1 = get_constant_metadata<unsigned_int>(node,4);
  uVar4 = get_constant_metadata<unsigned_int>(node,2);
  (this->execution_mode_meta).gs_stream_active_mask = uVar4;
  spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeInvocations,value1,-1,-1);
  spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputVertices,uVar2,-1,-1);
  uVar2 = uVar1 - 1;
  if (((byte)uVar2 < 7) && ((0x67U >> (uVar2 & 0x1f) & 1) != 0)) {
    uVar1 = (uVar2 & 0xff) << 2;
    uVar2 = *(uint *)(&DAT_001a0648 + uVar1);
    spv::Builder::addExecutionMode
              (this_00,entryPoint,*(ExecutionMode *)(&DAT_001a062c + uVar1),-1,-1,-1);
    (this->execution_mode_meta).stage_input_num_vertex = uVar2;
    if ((char)uVar3 == '\x05') {
      mode = ExecutionModeOutputTriangleStrip;
    }
    else if ((uVar3 & 0xff) == 3) {
      mode = ExecutionModeOutputLineStrip;
    }
    else {
      if ((uVar3 & 0xff) != 1) {
        p_Var6 = get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          pcVar7 = "[ERROR]: Unexpected output primitive topology (%u).\n";
          uVar1 = uVar3;
          goto LAB_0011bb66;
        }
        pcVar7 = "[ERROR]: Unexpected output primitive topology (%u).\n";
        goto LAB_0011baef;
      }
      mode = ExecutionModeOutputPoints;
    }
    spv::Builder::addExecutionMode(this_00,entryPoint,mode,-1,-1,-1);
    return true;
  }
  p_Var6 = get_thread_log_callback();
  if (p_Var6 == (LoggingCallback)0x0) {
    pcVar7 = "[ERROR]: Unexpected input primitive (%u).\n";
LAB_0011bb66:
    fprintf(_stderr,pcVar7,(ulong)(uVar1 & 0xff));
    fflush(_stderr);
    return false;
  }
  pcVar7 = "[ERROR]: Unexpected input primitive (%u).\n";
LAB_0011baef:
  snprintf(buffer,0x1000,pcVar7 + 9);
  pvVar5 = get_thread_log_callback_userdata();
  (*p_Var6)(pvVar5,Error,buffer);
  return false;
}

Assistant:

bool Converter::Impl::emit_execution_modes_geometry()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityGeometry);
	auto *gs_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::GSState);

	if (gs_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*gs_state_node);

		auto input_primitive = static_cast<DXIL::InputPrimitive>(get_constant_metadata(arguments, 0));
		unsigned max_vertex_count = get_constant_metadata(arguments, 1);

		auto *func = spirv_module.get_entry_function();

		auto topology = static_cast<DXIL::PrimitiveTopology>(get_constant_metadata(arguments, 3));
		unsigned gs_instances = get_constant_metadata(arguments, 4);

		execution_mode_meta.gs_stream_active_mask = get_constant_metadata(arguments, 2);

		builder.addExecutionMode(func, spv::ExecutionModeInvocations, gs_instances);
		builder.addExecutionMode(func, spv::ExecutionModeOutputVertices, max_vertex_count);

		switch (input_primitive)
		{
		case DXIL::InputPrimitive::Point:
			builder.addExecutionMode(func, spv::ExecutionModeInputPoints);
			execution_mode_meta.stage_input_num_vertex = 1;
			break;

		case DXIL::InputPrimitive::Line:
			builder.addExecutionMode(func, spv::ExecutionModeInputLines);
			execution_mode_meta.stage_input_num_vertex = 2;
			break;

		case DXIL::InputPrimitive::LineWithAdjacency:
			builder.addExecutionMode(func, spv::ExecutionModeInputLinesAdjacency);
			execution_mode_meta.stage_input_num_vertex = 4;
			break;

		case DXIL::InputPrimitive::Triangle:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			execution_mode_meta.stage_input_num_vertex = 3;
			break;

		case DXIL::InputPrimitive::TriangleWithAdjaceny:
			builder.addExecutionMode(func, spv::ExecutionModeInputTrianglesAdjacency);
			execution_mode_meta.stage_input_num_vertex = 6;
			break;

		default:
			LOGE("Unexpected input primitive (%u).\n", unsigned(input_primitive));
			return false;
		}

		switch (topology)
		{
		case DXIL::PrimitiveTopology::PointList:
			builder.addExecutionMode(func, spv::ExecutionModeOutputPoints);
			break;

		case DXIL::PrimitiveTopology::LineStrip:
			builder.addExecutionMode(func, spv::ExecutionModeOutputLineStrip);
			break;

		case DXIL::PrimitiveTopology::TriangleStrip:
			builder.addExecutionMode(func, spv::ExecutionModeOutputTriangleStrip);
			break;

		default:
			LOGE("Unexpected output primitive topology (%u).\n", unsigned(topology));
			return false;
		}
		return true;
	}
	else
		return false;
}